

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::cpp::QualifiedClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *d,Options *options)

{
  cpp *this_00;
  char *in_R8;
  Options *in_R9;
  string_view name;
  string local_38;
  
  this_00 = *(cpp **)(this + 0x18);
  ClassName_abi_cxx11_(&local_38,this,d);
  name._M_str = in_R8;
  name._M_len = (size_t)local_38._M_dataplus._M_p;
  QualifiedFileLevelSymbol_abi_cxx11_
            (__return_storage_ptr__,this_00,(FileDescriptor *)local_38._M_string_length,name,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedClassName(const Descriptor* d, const Options& options) {
  return QualifiedFileLevelSymbol(d->file(), ClassName(d), options);
}